

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Parameters PVar1;
  int iVar2;
  Incppect<false> *pIVar3;
  long *plVar4;
  char *__s;
  long lVar5;
  Parameters parameters;
  string httpRoot;
  undefined1 *puVar6;
  long lVar7;
  long in_stack_fffffffffffffe58;
  code *pcVar8;
  code *pcVar9;
  long *plVar10;
  undefined1 in_stack_fffffffffffffe70 [32];
  int32_t iVar11;
  int64_t iVar12;
  int32_t iVar13;
  undefined4 in_stack_fffffffffffffea4;
  _Alloc_hider _Var14;
  size_type sVar15;
  undefined2 uVar16;
  undefined1 in_stack_fffffffffffffeba [14];
  pointer pbVar17;
  pointer pbVar18;
  long local_e0;
  long local_d8;
  Parameters local_c0;
  
  printf("Usage: %s [port] [httpRoot]\n",*argv);
  iVar2 = 3000;
  if (1 < argc) {
    iVar2 = atoi(argv[1]);
  }
  if (argc < 3) {
    __s = "../examples";
  }
  else {
    __s = argv[2];
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,__s,(allocator<char> *)&stack0xfffffffffffffe90);
  iVar11 = 0x40000;
  iVar12 = 3000;
  iVar13 = 0x78;
  _Var14._M_p = &stack0xfffffffffffffeb8;
  uVar16 = 0x2e;
  sVar15 = 1;
  pbVar17 = (pointer)0x0;
  pbVar18 = (pointer)0x0;
  puVar6 = &stack0xfffffffffffffe58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffe48,local_e0,local_d8 + local_e0);
  std::__cxx11::string::append(&stack0xfffffffffffffe48);
  std::__cxx11::string::operator=
            ((string *)&stack0xfffffffffffffea8,(string *)&stack0xfffffffffffffe48);
  if (puVar6 != &stack0xfffffffffffffe58) {
    operator_delete(puVar6,in_stack_fffffffffffffe58 + 1);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe48,"");
  plVar4 = (long *)&stack0xfffffffffffffe78;
  plVar10 = plVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe68,"index.html","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &stack0xfffffffffffffec8,&stack0xfffffffffffffe48,&stack0xfffffffffffffe88);
  lVar5 = -0x40;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  pIVar3 = Incppect<false>::getInstance();
  lVar5 = 0;
  lVar7 = 0;
  pcVar9 = std::
           _Function_handler<void_(int,_Incppect<false>::EventType,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/send/main.cpp:23:37)>
           ::_M_invoke;
  pcVar8 = std::
           _Function_handler<void_(int,_Incppect<false>::EventType,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]incppect/examples/send/main.cpp:23:37)>
           ::_M_manager;
  Incppect<false>::handler((function *)pIVar3);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&stack0xfffffffffffffe48,&stack0xfffffffffffffe48,3);
  }
  Incppect<false>::getInstance();
  Incppect<false>::Parameters::Parameters(&local_c0,(Parameters *)&stack0xfffffffffffffe90);
  PVar1.tLastRequestTimeout_ms = lVar7;
  PVar1.portListen = (int)lVar5;
  PVar1.maxPayloadLength_bytes = (int)((ulong)lVar5 >> 0x20);
  PVar1._16_8_ = pcVar8;
  PVar1.httpRoot._M_dataplus._M_p = (pointer)pcVar9;
  PVar1.httpRoot._M_string_length = (size_type)plVar10;
  PVar1.httpRoot.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffe70._0_16_;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe70._16_8_;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe70._24_8_;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = iVar2;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar11;
  PVar1.sslKey._M_dataplus._M_p = (pointer)iVar12;
  PVar1.sslKey._M_string_length._0_4_ = iVar13;
  PVar1.sslKey._M_string_length._4_4_ = in_stack_fffffffffffffea4;
  PVar1.sslKey.field_2._M_allocated_capacity = (size_type)_Var14._M_p;
  PVar1.sslKey.field_2._8_8_ = sVar15;
  PVar1.sslCert._M_dataplus._M_p._0_2_ = uVar16;
  PVar1.sslCert._2_14_ = in_stack_fffffffffffffeba;
  PVar1.sslCert.field_2._M_allocated_capacity = (size_type)pbVar17;
  PVar1.sslCert.field_2._8_8_ = pbVar18;
  Incppect<false>::runAsync(PVar1);
  std::thread::detach();
  if (lVar5 == 0) {
    Incppect<false>::Parameters::~Parameters(&local_c0);
    do {
      do {
        iVar2 = nanosleep((timespec *)&stack0xfffffffffffffe48,(timespec *)&stack0xfffffffffffffe48)
        ;
      } while (iVar2 != -1);
      __errno_location();
    } while( true );
  }
  std::terminate();
}

Assistant:

int main(int argc, char ** argv) {
	printf("Usage: %s [port] [httpRoot]\n", argv[0]);

    int port = argc > 1 ? atoi(argv[1]) : 3000;
    std::string httpRoot = argc > 2 ? argv[2] : "../examples";

    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 256*1024;
    parameters.httpRoot = httpRoot + "/send";
    parameters.resources = { "", "index.html", };

    // handle input from the clients
    incppect::getInstance().handler([&](int clientId, incppect::EventType etype, std::string_view data) {
        switch (etype) {
            case incppect::Connect:
                {
                    printf("Client %d connected\n", clientId);
                }
                break;
            case incppect::Disconnect:
                {
                    printf("Client %d disconnected\n", clientId);
                }
                break;
            case incppect::Custom:
                {
                    printf("Client %d: '%s'\n", clientId, std::string(data.data(), data.size()).c_str());
                }
                break;
        };
    });

    incppect::getInstance().runAsync(parameters).detach();

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(1));
    }

    return 0;
}